

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuizmo.cpp
# Opt level: O1

void __thiscall ImGuizmo::matrix_t::RotationAxis(matrix_t *this,vec_t *axis,float angle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar1 = axis->z * axis->z + axis->x * axis->x + axis->y * axis->y;
  if (1.1920929e-07 <= fVar1) {
    if (fVar1 < 0.0) {
      fVar1 = sqrtf(fVar1);
    }
    else {
      fVar1 = SQRT(fVar1);
    }
    fVar1 = 1.0 / fVar1;
    fVar2 = axis->x * fVar1;
    fVar3 = axis->y * fVar1;
    fVar1 = fVar1 * axis->z;
    fVar4 = sinf(angle);
    fVar5 = cosf(angle);
    fVar9 = 1.0 - fVar5;
    fVar7 = fVar2 * fVar3 * fVar9;
    fVar6 = fVar3 * fVar1 * fVar9;
    fVar8 = fVar2 * fVar1 * fVar9;
    (this->field_0).m[0][0] = fVar2 * fVar2 * fVar9 + fVar5;
    (this->field_0).m[0][1] = fVar1 * fVar4 + fVar7;
    (this->field_0).m[0][2] = fVar8 - fVar3 * fVar4;
    (this->field_0).m[0][3] = 0.0;
    (this->field_0).m[1][0] = fVar7 - fVar1 * fVar4;
    (this->field_0).m[1][1] = fVar3 * fVar3 * fVar9 + fVar5;
    (this->field_0).m[1][2] = fVar2 * fVar4 + fVar6;
    (this->field_0).m[1][3] = 0.0;
    (this->field_0).m[2][0] = fVar3 * fVar4 + fVar8;
    (this->field_0).m[2][1] = fVar6 - fVar2 * fVar4;
    (this->field_0).m[2][2] = fVar1 * fVar1 * fVar9 + fVar5;
  }
  else {
    (this->field_0).m[0][0] = 1.0;
    *(undefined8 *)((long)&this->field_0 + 4) = 0;
    *(undefined8 *)((long)&this->field_0 + 0xc) = 0;
    (this->field_0).m[1][1] = 1.0;
    *(undefined8 *)((long)&this->field_0 + 0x18) = 0;
    *(undefined8 *)((long)&this->field_0 + 0x20) = 0;
    (this->field_0).m[2][2] = 1.0;
  }
  *(undefined8 *)((long)&this->field_0 + 0x2c) = 0;
  *(undefined8 *)((long)&this->field_0 + 0x34) = 0;
  (this->field_0).m[3][3] = 1.0;
  return;
}

Assistant:

void matrix_t::RotationAxis(const vec_t & axis, float angle)
   {
      float length2 = axis.LengthSq();
      if (length2 < FLT_EPSILON)
      {
         SetToIdentity();
         return;
      }

      vec_t n = axis * (1.f / sqrtf(length2));
      float s = sinf(angle);
      float c = cosf(angle);
      float k = 1.f - c;

      float xx = n.x * n.x * k + c;
      float yy = n.y * n.y * k + c;
      float zz = n.z * n.z * k + c;
      float xy = n.x * n.y * k;
      float yz = n.y * n.z * k;
      float zx = n.z * n.x * k;
      float xs = n.x * s;
      float ys = n.y * s;
      float zs = n.z * s;

      m[0][0] = xx;
      m[0][1] = xy + zs;
      m[0][2] = zx - ys;
      m[0][3] = 0.f;
      m[1][0] = xy - zs;
      m[1][1] = yy;
      m[1][2] = yz + xs;
      m[1][3] = 0.f;
      m[2][0] = zx + ys;
      m[2][1] = yz - xs;
      m[2][2] = zz;
      m[2][3] = 0.f;
      m[3][0] = 0.f;
      m[3][1] = 0.f;
      m[3][2] = 0.f;
      m[3][3] = 1.f;
   }